

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int pushParseTest(char *filename,char *result,char *err,int options)

{
  char *filename_00;
  char *pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  int size;
  char *base;
  char *local_48;
  char *local_40;
  char *local_38;
  
  nb_tests = nb_tests + 1;
  iVar2 = loadMem(filename,&base,&size);
  pcVar6 = base;
  iVar3 = size;
  if (iVar2 == 0) {
    lVar9 = (long)size;
    iVar2 = 4;
    if (size < 4) {
      iVar2 = size;
    }
    local_48 = filename;
    local_40 = err;
    local_38 = result;
    if (((uint)options >> 0x1e & 1) == 0) {
      lVar4 = xmlCreatePushParserCtxt(0,0,base,iVar2,filename);
    }
    else {
      lVar4 = htmlCreatePushParserCtxt(0,0,base,iVar2,filename,0);
    }
    xmlCtxtSetErrorHandler(lVar4,testStructuredErrorHandler,0);
    xmlCtxtUseOptions(lVar4,options);
    lVar5 = 4;
    if (lVar9 < 4) {
      lVar5 = lVar9;
    }
    lVar7 = lVar5 << 0x20;
    while (lVar5 + 0x400 < lVar9) {
      if (((uint)options >> 0x1e & 1) == 0) {
        xmlParseChunk();
      }
      else {
        htmlParseChunk(lVar4,pcVar6 + lVar5,0x400,0);
      }
      lVar7 = lVar7 + 0x40000000000;
      lVar5 = lVar5 + 0x400;
    }
    if (((uint)options >> 0x1e & 1) == 0) {
      xmlParseChunk();
      uVar8 = *(undefined8 *)(lVar4 + 0x10);
      iVar3 = *(int *)(lVar4 + 0x18);
      xmlFreeParserCtxt(lVar4);
      free(pcVar6);
      if (iVar3 == 0) {
        xmlFreeDoc(uVar8);
        pcVar6 = "Failed to parse %s\n";
        filename = local_48;
        goto LAB_001091bd;
      }
      xmlDocDumpMemory(uVar8,&base,&size);
    }
    else {
      htmlParseChunk(lVar4,pcVar6 + (lVar7 >> 0x20),(ulong)(uint)iVar3 - lVar5,1);
      uVar8 = *(undefined8 *)(lVar4 + 0x10);
      xmlFreeParserCtxt(lVar4);
      free(pcVar6);
      htmlDocDumpMemory(uVar8,&base,&size);
    }
    xmlFreeDoc(uVar8);
    pcVar1 = local_38;
    iVar3 = compareFileMem(local_38,base,size);
    filename_00 = local_40;
    pcVar6 = local_48;
    if ((base == (char *)0x0) || (iVar3 != 0)) {
      if (base != (char *)0x0) {
        (*_xmlFree)();
      }
      fprintf(_stderr,"Result for %s failed in %s\n",pcVar6,pcVar1);
      return -1;
    }
    (*_xmlFree)();
    filename = local_48;
    if (filename_00 == (char *)0x0) {
      return 0;
    }
    iVar3 = compareFileMem(filename_00,testErrors,testErrorsSize);
    if (iVar3 == 0) {
      return 0;
    }
    pcVar6 = "Error for %s failed\n";
  }
  else {
    pcVar6 = "Failed to load %s\n";
  }
LAB_001091bd:
  fprintf(_stderr,pcVar6,filename);
  return -1;
}

Assistant:

static int
pushParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
	     int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    const char *base;
    int size, res;
    int cur = 0;
    int chunkSize = 4;

    nb_tests++;
    /*
     * load the document in memory and work from there.
     */
    if (loadMem(filename, &base, &size) != 0) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

    if (chunkSize > size)
        chunkSize = size;

#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	ctxt = htmlCreatePushParserCtxt(NULL, NULL, base + cur, chunkSize, filename,
	                                XML_CHAR_ENCODING_NONE);
    else
#endif
    ctxt = xmlCreatePushParserCtxt(NULL, NULL, base + cur, chunkSize, filename);
    xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
    xmlCtxtUseOptions(ctxt, options);
    cur += chunkSize;
    chunkSize = 1024;
    do {
        if (cur + chunkSize >= size) {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML)
		htmlParseChunk(ctxt, base + cur, size - cur, 1);
	    else
#endif
	    xmlParseChunk(ctxt, base + cur, size - cur, 1);
	    break;
	} else {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML)
		htmlParseChunk(ctxt, base + cur, chunkSize, 0);
	    else
#endif
	    xmlParseChunk(ctxt, base + cur, chunkSize, 0);
	    cur += chunkSize;
	}
    } while (cur < size);
    doc = ctxt->myDoc;
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
        res = 1;
    else
#endif
    res = ctxt->wellFormed;
    xmlFreeParserCtxt(ctxt);
    free((char *)base);
    if (!res) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed to parse %s\n", filename);
	return(-1);
    }
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	htmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    else
#endif
    xmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    xmlFreeDoc(doc);
    res = compareFileMem(result, base, size);
    if ((base == NULL) || (res != 0)) {
	if (base != NULL)
	    xmlFree((char *)base);
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	return(-1);
    }
    xmlFree((char *)base);
    if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    return(-1);
	}
    }
    return(0);
}